

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_cast.hpp
# Opt level: O0

string * boost::unit_test::utils::string_cast<boost::unit_test::basic_cstring<char_const>>
                   (basic_cstring<const_char> *t)

{
  string *in_RDI;
  ostringstream buff;
  ostringstream local_188 [48];
  basic_cstring<const_char> *in_stack_fffffffffffffea8;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffeb0;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  unit_test::operator<<(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

inline std::string
string_cast( T const& t )
{
    std::ostringstream buff;
    buff << t;
    return buff.str();
}